

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * __thiscall
svg::Circle::toString_abi_cxx11_(string *__return_storage_ptr__,Circle *this,Layout *layout)

{
  ostream *poVar1;
  stringstream ss;
  allocator local_387;
  allocator local_386;
  allocator local_385;
  allocator local_384;
  allocator local_383;
  allocator local_382;
  allocator local_381;
  double local_380;
  double local_378;
  double local_370;
  string local_368 [32];
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::string::string((string *)&local_1e8,"circle",&local_381);
  elemStart(&local_1c8,&local_1e8);
  poVar1 = std::operator<<(local_198,(string *)&local_1c8);
  std::__cxx11::string::string((string *)&local_228,"cx",&local_382);
  local_370 = translateX((this->center).x,layout);
  std::__cxx11::string::string((string *)&local_248,"",&local_383);
  attribute<double>(&local_208,&local_228,&local_370,&local_248);
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  std::__cxx11::string::string((string *)&local_288,"cy",&local_384);
  local_378 = translateY((this->center).y,layout);
  std::__cxx11::string::string((string *)&local_2a8,"",&local_385);
  attribute<double>(&local_268,&local_288,&local_378,&local_2a8);
  poVar1 = std::operator<<(poVar1,(string *)&local_268);
  std::__cxx11::string::string((string *)&local_2e8,"r",&local_386);
  local_380 = this->radius * layout->scale;
  std::__cxx11::string::string((string *)&local_308,"",&local_387);
  attribute<double>(&local_2c8,&local_2e8,&local_380,&local_308);
  poVar1 = std::operator<<(poVar1,(string *)&local_2c8);
  Fill::toString_abi_cxx11_(&local_328,&(this->super_Shape).fill,layout);
  poVar1 = std::operator<<(poVar1,(string *)&local_328);
  Stroke::toString_abi_cxx11_(&local_348,&(this->super_Shape).stroke,layout);
  poVar1 = std::operator<<(poVar1,(string *)&local_348);
  emptyElemEnd_abi_cxx11_();
  std::operator<<(poVar1,local_368);
  std::__cxx11::string::~string(local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("circle") << attribute("cx", translateX(center.x, layout))
                << attribute("cy", translateY(center.y, layout))
                << attribute("r", translateScale(radius, layout)) << fill.toString(layout)
                << stroke.toString(layout) << emptyElemEnd();
            return ss.str();
        }